

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_util.cc
# Opt level: O3

void google::protobuf::internal::PrimitiveTypeHelper<3>::Serialize
               (void *ptr,CodedOutputStream *output)

{
  bool bVar1;
  byte *pbVar2;
  ulong uVar3;
  byte *ptr_00;
  ulong uVar4;
  ulong uVar5;
  
  uVar4 = *ptr;
  ptr_00 = output->cur_;
  if ((output->impl_).end_ <= ptr_00) {
    ptr_00 = io::EpsCopyOutputStream::EnsureSpaceFallback(&output->impl_,ptr_00);
  }
  output->cur_ = ptr_00;
  *ptr_00 = (byte)uVar4;
  if (uVar4 < 0x80) {
    pbVar2 = ptr_00 + 1;
  }
  else {
    *ptr_00 = (byte)uVar4 | 0x80;
    ptr_00[1] = (byte)(uVar4 >> 7);
    pbVar2 = ptr_00 + 2;
    if (0x3fff < uVar4) {
      uVar5 = (ulong)ptr_00[1];
      uVar4 = uVar4 >> 7;
      do {
        pbVar2[-1] = (byte)uVar5 | 0x80;
        uVar3 = uVar4 >> 7;
        *pbVar2 = (byte)uVar3;
        pbVar2 = pbVar2 + 1;
        uVar5 = uVar3 & 0xffffffff;
        bVar1 = 0x3fff < uVar4;
        uVar4 = uVar3;
      } while (bVar1);
    }
  }
  output->cur_ = pbVar2;
  return;
}

Assistant:

static void Serialize(const void* ptr, io::CodedOutputStream* output) {
    WireFormatLite::WriteInt64NoTag(Get<int64_t>(ptr), output);
  }